

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall
doctest::anon_unknown_14::JUnitReporter::test_run_end(JUnitReporter *this,TestRunStats *p)

{
  XmlWriter *this_00;
  pointer pJVar1;
  char *pcVar2;
  size_t sVar3;
  ContextOptions *pCVar4;
  pointer pJVar5;
  String *file;
  pointer attribute;
  tm timeInfo;
  char timeStamp [21];
  time_t rawtime;
  string binary_name;
  undefined1 local_128 [56];
  string local_f0;
  undefined1 local_d0 [32];
  JUnitReporter *local_b0;
  undefined1 local_a8 [40];
  pointer local_80;
  pointer local_78;
  string local_70;
  string local_50;
  
  pCVar4 = this->opt;
  if ((pCVar4->binary_name).field_0.buf[0x17] < '\0') {
    file = (String *)(pCVar4->binary_name).field_0.data.ptr;
  }
  else {
    file = &pCVar4->binary_name;
  }
  local_b0 = this;
  pcVar2 = skipPathFromFilename((char *)file);
  std::__cxx11::string::string((string *)&local_50,pcVar2,(allocator *)local_128);
  local_128._0_8_ = local_128 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"testsuites","");
  this_00 = &local_b0->xml;
  XmlWriter::startElement(this_00,(string *)local_128);
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  local_128._0_8_ = local_128 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"testsuite","");
  XmlWriter::startElement(this_00,(string *)local_128);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"name","");
  XmlWriter::writeAttribute(this_00,&local_f0,&local_50);
  local_d0._0_8_ = local_d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"errors","");
  XmlWriter::writeAttribute<int>(this_00,(string *)local_d0,&(local_b0->testCaseData).totalErrors);
  local_a8._0_8_ = (XmlWriter *)(local_a8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"failures","");
  XmlWriter::writeAttribute<int>(this_00,(string *)local_a8,&(local_b0->testCaseData).totalFailures)
  ;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"tests","");
  XmlWriter::writeAttribute<int>(this_00,&local_70,&p->numAsserts);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._0_8_ + 1);
  }
  if ((XmlWriter *)local_a8._0_8_ != (XmlWriter *)(local_a8 + 0x10)) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  if ((XmlWriter *)local_d0._0_8_ != (XmlWriter *)(local_d0 + 0x10)) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  pCVar4 = local_b0->opt;
  if (pCVar4->no_time_in_output == false) {
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"time","");
    XmlWriter::writeAttribute<double>
              (this_00,(string *)local_128,&(local_b0->testCaseData).totalSeconds);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"timestamp","");
    time((time_t *)&local_70);
    gmtime_r((time_t *)&local_70,(tm *)local_128);
    strftime(local_a8,0x15,"%Y-%m-%dT%H:%M:%SZ",(tm *)local_128);
    local_d0._0_8_ = local_d0 + 0x10;
    sVar3 = strlen(local_a8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,local_a8,local_a8 + sVar3);
    XmlWriter::writeAttribute(this_00,&local_f0,(string *)local_d0);
    if ((XmlWriter *)local_d0._0_8_ != (XmlWriter *)(local_d0 + 0x10)) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    pCVar4 = local_b0->opt;
  }
  if (pCVar4->no_version == false) {
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"doctest_version","");
    XmlWriter::writeAttribute(this_00,(string *)local_128,"2.4.6");
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
  }
  attribute = (local_b0->testCaseData).testcases.
              super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_78 = (local_b0->testCaseData).testcases.
             super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (attribute != local_78) {
    do {
      local_128._0_8_ = local_128 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"testcase","");
      XmlWriter::startElement(this_00,(string *)local_128);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"classname","");
      XmlWriter::writeAttribute(this_00,&local_f0,&attribute->classname);
      local_d0._0_8_ = local_d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"name","");
      XmlWriter::writeAttribute(this_00,(string *)local_d0,&attribute->name);
      if ((XmlWriter *)local_d0._0_8_ != (XmlWriter *)(local_d0 + 0x10)) {
        operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
        operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
      }
      if (local_b0->opt->no_time_in_output == false) {
        local_128._0_8_ = local_128 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"time","");
        XmlWriter::writeAttribute<double>(this_00,(string *)local_128,&attribute->time);
        if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
          operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
        }
      }
      local_128._0_8_ = local_128 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"status","");
      XmlWriter::writeAttribute(this_00,(string *)local_128,"run");
      if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
        operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
      }
      pJVar1 = (attribute->failures).
               super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_80 = attribute;
      for (pJVar5 = (attribute->failures).
                    super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                    ._M_impl.super__Vector_impl_data._M_start; pJVar5 != pJVar1; pJVar5 = pJVar5 + 1
          ) {
        local_128._0_8_ = local_128 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"failure","");
        local_a8._0_8_ = this_00;
        XmlWriter::startElement(this_00,(string *)local_128);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"message","");
        XmlWriter::writeAttribute((XmlWriter *)local_a8._0_8_,&local_f0,&pJVar5->message);
        local_d0._0_8_ = local_d0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"type","");
        XmlWriter::writeAttribute((XmlWriter *)local_a8._0_8_,(string *)local_d0,&pJVar5->type);
        XmlWriter::ScopedElement::writeText((ScopedElement *)local_a8,&pJVar5->details,false);
        if ((XmlWriter *)local_d0._0_8_ != (XmlWriter *)(local_d0 + 0x10)) {
          operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a8._0_8_);
        if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
          operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
        }
      }
      pJVar1 = (local_80->errors).
               super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pJVar5 = (local_80->errors).
                    super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                    ._M_impl.super__Vector_impl_data._M_start; pJVar5 != pJVar1; pJVar5 = pJVar5 + 1
          ) {
        local_128._0_8_ = local_128 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"error","");
        local_d0._0_8_ = this_00;
        XmlWriter::startElement(this_00,(string *)local_128);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"message","");
        XmlWriter::writeAttribute((XmlWriter *)local_d0._0_8_,&local_f0,&pJVar5->message);
        XmlWriter::ScopedElement::writeText((ScopedElement *)local_d0,&pJVar5->details,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_d0._0_8_);
        if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
          operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
        }
      }
      XmlWriter::endElement(this_00);
      attribute = local_80 + 1;
    } while (attribute != local_78);
  }
  XmlWriter::endElement(this_00);
  XmlWriter::endElement(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void test_run_end(const TestRunStats& p) override {
            // remove .exe extension - mainly to have the same output on UNIX and Windows
            std::string binary_name = skipPathFromFilename(opt.binary_name.c_str());
#ifdef DOCTEST_PLATFORM_WINDOWS
            if(binary_name.rfind(".exe") != std::string::npos)
                binary_name = binary_name.substr(0, binary_name.length() - 4);
#endif // DOCTEST_PLATFORM_WINDOWS
            xml.startElement("testsuites");
            xml.startElement("testsuite").writeAttribute("name", binary_name)
                    .writeAttribute("errors", testCaseData.totalErrors)
                    .writeAttribute("failures", testCaseData.totalFailures)
                    .writeAttribute("tests", p.numAsserts);
            if(opt.no_time_in_output == false) {
                xml.writeAttribute("time", testCaseData.totalSeconds);
                xml.writeAttribute("timestamp", JUnitTestCaseData::getCurrentTimestamp());
            }
            if(opt.no_version == false)
                xml.writeAttribute("doctest_version", DOCTEST_VERSION_STR);

            for(const auto& testCase : testCaseData.testcases) {
                xml.startElement("testcase")
                    .writeAttribute("classname", testCase.classname)
                    .writeAttribute("name", testCase.name);
                if(opt.no_time_in_output == false)
                    xml.writeAttribute("time", testCase.time);
                // This is not ideal, but it should be enough to mimic gtest's junit output.
                xml.writeAttribute("status", "run");

                for(const auto& failure : testCase.failures) {
                    xml.scopedElement("failure")
                        .writeAttribute("message", failure.message)
                        .writeAttribute("type", failure.type)
                        .writeText(failure.details, false);
                }

                for(const auto& error : testCase.errors) {
                    xml.scopedElement("error")
                        .writeAttribute("message", error.message)
                        .writeText(error.details);
                }

                xml.endElement();
            }
            xml.endElement();
            xml.endElement();
        }